

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# args.cc
# Opt level: O1

string * __thiscall
fasttext::Args::modelToString_abi_cxx11_(string *__return_storage_ptr__,Args *this,model_name mn)

{
  char *pcVar1;
  char *pcVar2;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  if (mn == sup) {
    pcVar2 = "sup";
    pcVar1 = "";
  }
  else if (mn == sg) {
    pcVar2 = "sg";
    pcVar1 = "";
  }
  else if (mn == cbow) {
    pcVar2 = "cbow";
    pcVar1 = "";
  }
  else {
    pcVar2 = "Unknown model name!";
    pcVar1 = "";
  }
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar2,pcVar1);
  return __return_storage_ptr__;
}

Assistant:

std::string Args::modelToString(model_name mn) const {
  switch (mn) {
    case model_name::cbow:
      return "cbow";
    case model_name::sg:
      return "sg";
    case model_name::sup:
      return "sup";
  }
  return "Unknown model name!"; // should never happen
}